

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O1

void __thiscall Screen_Manager::Remove(Screen_Manager *this,Screen_Info *screen)

{
  uint uVar1;
  __fd_mask *p_Var2;
  byte bVar3;
  int iVar4;
  int iVar5;
  Screen_Info *pSVar6;
  
  if (this->head == screen) {
    pSVar6 = (Screen_Info *)0x0;
    if (screen->next != screen) {
      pSVar6 = screen->next;
    }
    this->head = pSVar6;
  }
  iVar4 = XConnectionNumber(screen->dpy);
  bVar3 = (byte)iVar4 & 0x3f;
  iVar5 = iVar4 + 0x3f;
  if (-1 < iVar4) {
    iVar5 = iVar4;
  }
  p_Var2 = (this->read_flag).fds_bits + (iVar5 >> 6);
  *p_Var2 = *p_Var2 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
  if (0 < this->nfds) {
    iVar5 = this->nfds + 1;
    do {
      uVar1 = iVar5 - 2;
      if (((ulong)(this->read_flag).fds_bits[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0) break;
      this->nfds = uVar1;
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  pSVar6 = screen->next;
  pSVar6->prev = screen->prev;
  screen->prev->next = pSVar6;
  if (screen != (Screen_Info *)0x0) {
    if (screen->name != (char *)0x0) {
      operator_delete__(screen->name);
    }
    operator_delete(screen);
    return;
  }
  return;
}

Assistant:

void
Screen_Manager::Remove(Screen_Manager::Screen_Info *screen)
{
  if (head == screen)
    head = (screen->next == screen) ? nullptr : screen->next;

  int fd = XConnectionNumber(screen->dpy);
  FD_CLR(fd, &read_flag);
  while (nfds > 0 && !FD_ISSET(nfds - 1, &read_flag))
    --nfds;

  screen->next->prev = screen->prev;
  screen->prev->next = screen->next;
  delete screen;
}